

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void quicly__debug_printf(quicly_conn_t *conn,char *function,int line,char *fmt,...)

{
  return;
}

Assistant:

void quicly__debug_printf(quicly_conn_t *conn, const char *function, int line, const char *fmt, ...)
{
#if QUICLY_USE_EMBEDDED_PROBES || QUICLY_USE_DTRACE
    char buf[1024];
    va_list args;

    if (!QUICLY_DEBUG_MESSAGE_ENABLED())
        return;

    va_start(args, fmt);
    vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);

    QUICLY_DEBUG_MESSAGE(conn, function, line, buf);
#endif
}